

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O1

void detectDrawEyes(Mat *img,Mat *img_gray)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  __m128d t;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> eyes;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  CascadeClassifier eyes_cascade;
  Mat faceROI;
  undefined8 *puVar5;
  _InputArray local_198;
  undefined8 uStack_180;
  void *local_178;
  void *pvStack_170;
  long local_168;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_158;
  int local_140;
  int local_13c;
  Mat *local_138;
  ulong local_130;
  undefined8 local_128;
  undefined8 local_120;
  CascadeClassifier local_118 [16];
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 uStack_f8;
  long *local_f0 [2];
  long local_e0 [10];
  Mat local_90 [96];
  
  local_138 = img_gray;
  cv::Mat::Mat(local_90,img_gray);
  detectFaces(&local_158,local_90);
  cv::Mat::~Mat(local_90);
  if (local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      local_130 = uVar3;
      cv::Mat::Mat((Mat *)local_f0,local_138,
                   (Rect_ *)(local_158.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar3));
      cv::CascadeClassifier::CascadeClassifier(local_118);
      local_198._0_8_ = &local_198.sz;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml",""
                );
      cv::CascadeClassifier::load((string *)local_118);
      if ((Size *)local_198._0_8_ != &local_198.sz) {
        operator_delete((void *)local_198._0_8_,(long)local_198.sz + 1);
      }
      local_168 = 0;
      local_178 = (void *)0x0;
      pvStack_170 = (void *)0x0;
      local_198.sz.width = 0;
      local_198.sz.height = 0;
      local_198.flags = 0x1010000;
      local_120 = 0x1e0000001e;
      local_128 = 0;
      puVar5 = &local_128;
      local_198.obj = (Mat *)local_f0;
      cv::CascadeClassifier::detectMultiScale
                (0x9999999a,local_118,(string *)&local_198,&local_178,2,2,&local_120,puVar5);
      if (pvStack_170 != local_178) {
        lVar2 = 0xc;
        uVar4 = 0;
        do {
          iVar1 = *(int *)((long)local_178 + lVar2 + -4);
          local_140 = iVar1 / 2 +
                      *(int *)((long)local_178 + lVar2 + -0xc) +
                      local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3].x;
          local_13c = *(int *)((long)local_178 + lVar2) / 2 +
                      *(int *)((long)local_178 + lVar2 + -8) +
                      local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3].y;
          uStack_f8 = 0;
          local_108[0] = 0x3010000;
          local_198._0_8_ = (Size *)0x406fe00000000000;
          local_198.obj = (Mat *)0x0;
          local_198.sz.width = 0;
          local_198.sz.height = 0;
          uStack_180 = 0;
          puVar5 = (undefined8 *)((ulong)puVar5 & 0xffffffff00000000);
          local_100 = img;
          cv::circle(local_108,&local_140,
                     (int)ROUND((double)(*(int *)((long)local_178 + lVar2) + iVar1) * 0.25),
                     (string *)&local_198,1,8,puVar5);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 0x10;
        } while (uVar4 < (ulong)((long)pvStack_170 - (long)local_178 >> 4));
      }
      uVar3 = local_130;
      if (local_178 != (void *)0x0) {
        operator_delete(local_178,local_168 - (long)local_178);
      }
      cv::CascadeClassifier::~CascadeClassifier(local_118);
      cv::Mat::~Mat((Mat *)local_f0);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_158.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"detect and draw eyes","");
  cv::namedWindow((string *)local_f0,1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"detect and draw eyes","");
  local_198.sz.width = 0;
  local_198.sz.height = 0;
  local_198.flags = 0x1010000;
  local_198.obj = img;
  cv::imshow((string *)local_f0,&local_198);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void detectDrawEyes(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    Mat faceROI = img_gray(faces[i]);
    CascadeClassifier eyes_cascade;
    eyes_cascade.load(
        "/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml");
    vector<Rect> eyes;
    eyes_cascade.detectMultiScale(faceROI, eyes, 1.1, 2,
                                  0 | CASCADE_SCALE_IMAGE, Size(30, 30));
    for (size_t j = 0; j < eyes.size(); j++) {
      Point eyes_center(faces[i].x + eyes[j].x + eyes[j].width / 2,
                        faces[i].y + eyes[j].y + eyes[j].height / 2);
      int r = cvRound((eyes[j].width + eyes[j].height) * 0.25);
      circle(img, eyes_center, r, Scalar(255, 0, 0), 1, 8, 0);
    }
  }
  namedWindow("detect and draw eyes");
  imshow("detect and draw eyes", img);
}